

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void __thiscall FWeaponSlot::AddWeaponList(FWeaponSlot *this,char *list,bool clear)

{
  char *__s;
  char *type;
  FString copy;
  FString local_20;
  
  FString::FString(&local_20,list);
  __s = FString::LockBuffer(&local_20);
  if (clear) {
    TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Clear(&this->Weapons);
  }
  while( true ) {
    type = strtok(__s," ");
    if (type == (char *)0x0) break;
    __s = (char *)0x0;
    AddWeapon(this,type);
  }
  FString::~FString(&local_20);
  return;
}

Assistant:

void FWeaponSlot :: AddWeaponList(const char *list, bool clear)
{
	FString copy(list);
	char *buff = copy.LockBuffer();
	char *tok;

	if (clear)
	{
		Clear();
	}
	tok = strtok(buff, " ");
	while (tok != NULL)
	{
		AddWeapon(tok);
		tok = strtok(NULL, " ");
	}
}